

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

void __thiscall
format_iter::format_iter(format_iter *this,char **builtin,size_t builtin_cnt,vm_val_t *custom)

{
  int iVar1;
  char *pcVar2;
  int *in_RCX;
  vm_val_t *in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  
  (in_RDI->val).native_desc = (CVmNativeCodeDesc *)in_RSI;
  *(vm_val_t **)(in_RDI + 1) = in_RDX;
  *(int **)(in_RDI + 2) = in_RCX;
  in_RDI->typ = 0;
  if ((in_RCX == (int *)0x0) || (*in_RCX == 1)) {
    in_RDI[2].val.ptr = (void *)0x0;
    in_RDI->typ = VM_NIL;
  }
  else {
    pcVar2 = vm_val_t::get_as_string(in_RDI);
    if (pcVar2 == (char *)0x0) {
      iVar1 = vm_val_t::is_listlike(in_RSI);
      if (iVar1 == 0) {
        err_throw(0);
      }
      iVar1 = vm_val_t::ll_length(in_RDX);
      in_RDI[2].val = (anon_union_8_8_cb74652f_for_val)(long)iVar1;
    }
    else {
      in_RDI[2].val = (anon_union_8_8_cb74652f_for_val)0x1;
    }
  }
  in_RDI[1].val.ptr = (void *)0x0;
  *(undefined8 *)(in_RDI + 3) = 0;
  return;
}

Assistant:

format_iter(VMG_ const char **builtin, size_t builtin_cnt,
                const vm_val_t *custom)
    {
        /* save the source lists */
        this->builtin = builtin;
        this->builtin_cnt = builtin_cnt;
        this->custom = custom;

        /* presume we'll start in the custom list */
        this->mode = 0;

        /* figure how many builtin items we have, if any */
        if (custom == 0 || custom->typ == VM_NIL)
        {
            /* no custom items - just use the builtin list */
            this->custom_cnt = 0;
            this->mode = 1;
        }
        else if (custom->get_as_string(vmg0_) != 0)
            this->custom_cnt = 1;
        else if (custom->is_listlike(vmg0_))
            this->custom_cnt = custom->ll_length(vmg0_);
        else
            err_throw(VMERR_BAD_TYPE_BIF);

        /* start at the top of each list */
        this->bidx = 0;
        this->cidx = 0;
    }